

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChInertiaUtils.h
# Opt level: O1

void chrono::ChInertiaUtils::PrincipalInertia
               (ChMatrix33<double> *inertia,ChVector<double> *principal_inertia,
               ChMatrix33<double> *principal_axes)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  SrcEvaluatorType srcEvaluator;
  EigenvectorsType *pEVar10;
  ActualDstType actualDst;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> es;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_a8;
  
  local_a8.m_isInitialized = false;
  local_a8.m_eigenvectorsOk = false;
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,1,3,3>>::
  compute<Eigen::Matrix<double,3,3,1,3,3>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,1,3,3>> *)&local_a8,
             (EigenBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)inertia,0x80);
  if (local_a8.m_isInitialized != false) {
    pEVar10 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::eigenvectors
                        (&local_a8);
    dVar1 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[0];
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar1;
    dVar2 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[3];
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar2;
    dVar3 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[6];
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar3;
    dVar4 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar4;
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar4;
    dVar5 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[4];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar5;
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar5;
    dVar6 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[7];
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar6;
    dVar7 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[2];
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar7;
    dVar8 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[5];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar8;
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar8;
    dVar9 = (pEVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[8];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar9;
    (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar9;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar8 * dVar6;
    auVar15 = vfmsub231sd_fma(auVar20,auVar15,auVar19);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar7 * dVar6;
    auVar17 = vfmsub231sd_fma(auVar17,auVar14,auVar19);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar7 * dVar5;
    auVar14 = vfmsub231sd_fma(auVar16,auVar14,auVar18);
    if (dVar3 * auVar14._0_8_ + (auVar15._0_8_ * dVar1 - dVar2 * auVar17._0_8_) < 0.0) {
      auVar11._0_8_ = -dVar1;
      auVar11._8_8_ = 0x8000000000000000;
      dVar1 = (double)vmovlpd_avx(auVar11);
      (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar1
      ;
      auVar12._0_8_ = -dVar4;
      auVar12._8_8_ = 0x8000000000000000;
      dVar1 = (double)vmovlpd_avx(auVar12);
      (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar1
      ;
      auVar13._0_8_ = -dVar7;
      auVar13._8_8_ = 0x8000000000000000;
      dVar1 = (double)vmovlpd_avx(auVar13);
      (principal_axes->super_Matrix<double,_3,_3,_1,_3,_3>).
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar1
      ;
    }
    principal_inertia->m_data[0] =
         local_a8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    principal_inertia->m_data[1] =
         local_a8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
    principal_inertia->m_data[2] =
         local_a8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    return;
  }
  __assert_fail("m_isInitialized && \"SelfAdjointEigenSolver is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/Eigenvalues/SelfAdjointEigenSolver.h",0x12e,
                "const RealVectorType &Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double, 3, 3, 1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, 3, 3, 1>]"
               );
}

Assistant:

static void PrincipalInertia(const ChMatrix33<>& inertia,
                                 ChVector<>& principal_inertia,
                                 ChMatrix33<>& principal_axes) {
        ChVectorN<double, 3> principal_I;
        inertia.SelfAdjointEigenSolve(principal_axes, principal_I);

        // Ensure the principal_axes represent a proper rotation matrix.
        // If the determinant is -1, flip the sign of one of the eigenvectors to obtain a proper rotation
        // (i.e. a transformation representing a right-handed rotation)
        if (principal_axes.determinant() < 0) {
            principal_axes.col(0) *= -1;
        }

        // Return the principal moments of inertia in a ChVector
        principal_inertia = principal_I;

        // Tests
        ////std::cout << "Input inertia matrix: J\n" << inertia << std::endl;
        ////std::cout << "Principal moments of inertia: I\n" << principal_I << std::endl;
        ////std::cout << "Principal axes: R\n" << principal_axes << std::endl;
        ////std::cout << "det(R) = " << principal_axes.determinant() << std::endl;
        ////std::cout << "Transform back: R * diag(I) * R'\n"
        ////          << principal_axes * ChMatrix33<>(principal_inertia) * principal_axes.transpose() << std::endl;
    }